

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_delay.cpp
# Opt level: O2

void __thiscall tst_qpromise_delay::fulfilledStdChrono(tst_qpromise_delay *this)

{
  QSharedData *pQVar1;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<void>_> QVar2;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> QVar3;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> QVar4;
  bool bVar5;
  char cVar6;
  int iVar7;
  PromiseDataBase<void,_void_()> *this_00;
  PromiseData<int> *this_01;
  QPromiseReject<int> *in_R8;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_180;
  PromiseResolver<int> resolver_1;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_170;
  _Any_data local_168;
  Data *local_158;
  PromiseData<int> *pPStack_150;
  PromiseResolver<void> resolver;
  QPromiseBase<void> local_138;
  QPromiseBase<int> local_128;
  QPromise<int> p_1;
  QPromise<int> p;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_f8;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_f0;
  qint64 elapsed;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_e0;
  function<void_()> local_d8;
  QPromiseBase<int> local_b0;
  int local_9c;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  QPromiseBase<int> local_50;
  QElapsedTimer timer;
  
  timer.t1 = -0x8000000000000000;
  timer.t2 = -0x8000000000000000;
  elapsed = -1;
  QElapsedTimer::start();
  local_9c = 0x2a;
  QtPromise::QPromise<int>::resolve((QPromise<int> *)&local_50,&local_9c);
  QtPromise::QPromiseBase<int>::tap<QtPromise::QPromiseBase<int>::delay(int)const::_lambda()_1_>
            (&local_b0,(anon_class_4_1_898ef5c2)(int)&local_50);
  p_1.super_QPromiseBase<int>.m_d.d = local_b0.m_d.d;
  if (local_b0.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((local_b0.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  p_1.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00118a98;
  local_138._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00118c40;
  this_00 = (PromiseDataBase<void,_void_()> *)operator_new(0x58);
  (this_00->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_00->m_catchers).d.size = 0;
  (this_00->m_handlers).d.size = 0;
  (this_00->m_catchers).d.d = (Data *)0x0;
  (this_00->m_handlers).d.d = (Data *)0x0;
  (this_00->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_()>_> *)0x0;
  *(undefined8 *)&this_00->m_lock = 0;
  *(undefined8 *)&this_00->m_settled = 0;
  ((PromiseDataBase<void,_void_()> *)&this_00->_vptr_PromiseDataBase)->_vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)&this_00->super_QSharedData = 0;
  (this_00->m_error).m_data._M_exception_object = (void *)0x0;
  QtPromisePrivate::PromiseData<void>::PromiseData((PromiseData<void> *)this_00);
  local_e0.d = (Data *)&PTR__QPromiseBase_00118a98;
  LOCK();
  (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (this_00 != (PromiseDataBase<void,_void_()> *)0x0) {
    LOCK();
    (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
         _q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_d8.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_00118bf8;
  local_138.m_d.d = (PromiseData<void> *)this_00;
  local_d8.super__Function_base._M_functor._8_8_ = this_00;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver,(QPromise<void> *)&local_d8);
  QtPromise::QPromiseBase<void>::~QPromiseBase((QPromiseBase<void> *)&local_d8);
  QVar3 = p_1.super_QPromiseBase<int>.m_d;
  if (resolver.m_d.d == (Data *)0x0) {
    resolver.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)(Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  resolver_1.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)(Data *)0x0;
  if (resolver.m_d.d == (Data *)0x0) {
    local_180.d = (Data *)0x0;
  }
  else {
    LOCK();
    (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_180.d = (Data *)resolver.m_d.d;
  }
  local_170.d = (Data *)0x0;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (local_180.d != (Data *)0x0) {
    LOCK();
    ((local_180.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_180.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_68 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  local_168._M_unused._0_8_ = resolver.m_d.d;
  local_168._8_8_ = local_180.d;
  local_158 = (Data *)&elapsed;
  pPStack_150 = (PromiseData<int> *)&timer;
  local_128._vptr_QPromiseBase = (_func_int **)resolver.m_d.d;
  local_78._M_unused._M_object = operator_new(0x20);
  *(void **)local_78._M_unused._0_8_ = local_168._M_unused._M_object;
  if ((Data *)local_168._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_168._M_unused._0_8_ = *local_168._M_unused._M_object + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)local_78._M_unused._0_8_ + 8) = local_168._8_8_;
  if ((Data *)local_168._8_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_168._8_8_ = *(int *)local_168._8_8_ + 1;
    UNLOCK();
  }
  *(Data **)((long)local_78._M_unused._0_8_ + 0x10) = local_158;
  *(PromiseData<int> **)((long)local_78._M_unused._0_8_ + 0x18) = pPStack_150;
  pcStack_60 = std::
               _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
             ::_M_manager;
  QtPromisePrivate::PromiseHandler<int,tst_qpromise_delay::fulfilledStdChrono()::$_0,void>::
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>(tst_qpromise_delay::fulfilledStdChrono()::$_0_const&,QtPromise::QPromiseResolve<void>const&,QtPromise::QPromiseReject<void>const&)
  ::{lambda(int_const&)#1}::~function((_lambda_int_const___1_ *)local_168._M_pod_data);
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
            (&(QVar3.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
             (function<void_(const_int_&)> *)&local_78);
  std::_Function_base::~_Function_base((_Function_base *)&local_78);
  QVar3 = p_1.super_QPromiseBase<int>.m_d;
  local_168._M_unused._M_object = local_128._vptr_QPromiseBase;
  if ((Data *)local_128._vptr_QPromiseBase != (Data *)0x0) {
    LOCK();
    (((QSharedData *)local_128._vptr_QPromiseBase)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)local_128._vptr_QPromiseBase)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_168._8_8_ = local_180.d;
  if (local_180.d != (Data *)0x0) {
    LOCK();
    ((local_180.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_180.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pPStack_150 = (PromiseData<int> *)&timer;
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  local_88 = (code *)0x0;
  pcStack_80 = (code *)0x0;
  local_158 = (Data *)&elapsed;
  local_98._M_unused._M_object = operator_new(0x20);
  *(void **)local_98._M_unused._0_8_ = local_168._M_unused._M_object;
  if ((Data *)local_168._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_168._M_unused._0_8_ = *local_168._M_unused._M_object + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)local_98._M_unused._0_8_ + 8) = local_168._8_8_;
  if ((Data *)local_168._8_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_168._8_8_ = *(int *)local_168._8_8_ + 1;
    UNLOCK();
  }
  *(Data **)((long)local_98._M_unused._0_8_ + 0x10) = local_158;
  *(PromiseData<int> **)((long)local_98._M_unused._0_8_ + 0x18) = pPStack_150;
  pcStack_80 = std::
               _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
               ::_M_invoke;
  local_88 = std::
             _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
             ::_M_manager;
  QtPromisePrivate::PromiseCatcher<int,tst_qpromise_delay::fulfilledStdChrono()::$_0,void>::
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>(tst_qpromise_delay::fulfilledStdChrono()::$_0_const&,QtPromise::QPromiseResolve<void>const&,QtPromise::QPromiseReject<void>const&)
  ::{lambda(QtPromisePrivate::PromiseError_const&)#1}::~function
            ((_lambda_QtPromisePrivate__PromiseError_const___1_ *)local_168._M_pod_data);
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher
            (&(QVar3.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_98);
  std::_Function_base::~_Function_base((_Function_base *)&local_98);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
             &local_180);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
             &local_170);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
             &local_128);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
             &resolver_1);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&resolver.m_d);
  local_138._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00118bf8;
  bVar5 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                    (&(p_1.super_QPromiseBase<int>.m_d.d)->
                      super_PromiseDataBase<int,_void_(const_int_&)>);
  if (!bVar5) {
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch
              (&(p_1.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>)
    ;
  }
  QVar4.d = local_e0.d;
  local_128.m_d.d = p_1.super_QPromiseBase<int>.m_d.d;
  if (p_1.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((p_1.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_128._vptr_QPromiseBase = (_func_int **)local_e0.d;
  p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00118a68;
  this_01 = (PromiseData<int> *)operator_new(0x68);
  (this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
       (void *)0x0;
  (this_01->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
  (this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
  (this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
  (this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
  (this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_()>_> *)0x0;
  *(undefined8 *)&(this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock = 0;
  *(undefined8 *)&(this_01->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = 0;
  (this_01->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)&(this_01->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData = 0;
  (this_01->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  QtPromisePrivate::PromiseData<int>::PromiseData(this_01);
  LOCK();
  pQVar1 = &(this_01->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (this_01 != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &(this_01->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)QVar4.d;
  p.super_QPromiseBase<int>.m_d.d = this_01;
  QtPromisePrivate::PromiseResolver<int>::PromiseResolver(&resolver_1,(QPromise<int> *)&resolver);
  QtPromise::QPromiseBase<int>::~QPromiseBase((QPromiseBase<int> *)&resolver);
  QVar2.d = local_138.m_d.d;
  if (resolver_1.m_d.d == (Data *)0x0) {
    local_180.d = (Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
    local_180 = resolver_1.m_d.d;
  }
  local_170.d = (Data *)0x0;
  if (local_180.d == (Data *)0x0) {
    local_168._8_8_ = (Data *)0x0;
  }
  else {
    LOCK();
    ((local_180.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_180.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_168._8_8_ = local_180.d;
  }
  local_f8.d = (Data *)0x0;
  if (local_180.d != (Data *)0x0) {
    LOCK();
    ((local_180.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_180.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if ((Data *)local_168._8_8_ != (Data *)0x0) {
    LOCK();
    (((Data *)local_168._8_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_168._8_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pPStack_150 = local_128.m_d.d;
  if (local_128.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((local_128.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_158 = QVar4.d;
  local_d8.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_d8.super__Function_base._M_functor._8_8_ = 0;
  local_d8.super__Function_base._M_manager = (_Manager_type)0x0;
  local_d8._M_invoker = (_Invoker_type)0x0;
  local_168._M_unused._0_8_ = (undefined8)local_180.d;
  local_f0.d = (Data *)local_168._8_8_;
  local_d8.super__Function_base._M_functor._M_unused._M_object = operator_new(0x20);
  *(void **)local_d8.super__Function_base._M_functor._M_unused._0_8_ = local_168._M_unused._M_object
  ;
  if ((Data *)local_168._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_168._M_unused._0_8_ = *local_168._M_unused._M_object + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)local_d8.super__Function_base._M_functor._M_unused._0_8_ + 8) =
       local_168._8_8_;
  if ((Data *)local_168._8_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_168._8_8_ = *(int *)local_168._8_8_ + 1;
    UNLOCK();
  }
  *(undefined ***)((long)local_d8.super__Function_base._M_functor._M_unused._0_8_ + 0x10) =
       &PTR__QPromiseBase_00118a68;
  *(PromiseData<int> **)((long)local_d8.super__Function_base._M_functor._M_unused._0_8_ + 0x18) =
       pPStack_150;
  if (pPStack_150 != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &(pPStack_150->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(Data **)((long)local_d8.super__Function_base._M_functor._M_unused._0_8_ + 0x10) = QVar4.d;
  local_d8._M_invoker =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
       ::_M_invoke;
  local_d8.super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
       ::_M_manager;
  QtPromisePrivate::
  PromiseHandler<void,QtPromise::QPromiseBase<int>::finally<tst_qpromise_delay::fulfilledStdChrono()::$_0>(tst_qpromise_delay::fulfilledStdChrono()::$_0)const::{lambda()#1}()#1},void>
  ::
  create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>(QtPromise::QPromiseBase<int>::finally<tst_qpromise_delay::fulfilledStdChrono()::$_0>(tst_qpromise_delay::fulfilledStdChrono()::$_0)const::{lambda()#1}()#1}const&,QtPromise::QPromiseResolve<int>const&,QtPromise::QPromiseReject<int>const&)
  ::{lambda()#1}::~function((_lambda___1_ *)local_168._M_pod_data);
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addHandler
            (&(QVar2.d)->super_PromiseDataBase<void,_void_()>,&local_d8);
  std::_Function_base::~_Function_base(&local_d8.super__Function_base);
  QVar2.d = local_138.m_d.d;
  QtPromisePrivate::PromiseCatcher<void,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>
            ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_168,
             (PromiseCatcher<void,decltype(nullptr),void> *)0x0,&local_180,
             (QPromiseResolve<int> *)&local_f0,in_R8);
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addCatcher
            (&(QVar2.d)->super_PromiseDataBase<void,_void_()>,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_168);
  std::_Function_base::~_Function_base((_Function_base *)&local_168);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&local_f0);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&local_f8);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&local_180);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&local_170);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>::
  ~QExplicitlySharedDataPointer(&resolver_1.m_d);
  p.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)QVar4.d;
  bVar5 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                    (&(local_138.m_d.d)->super_PromiseDataBase<void,_void_()>);
  if (!bVar5) {
    QtPromisePrivate::PromiseDataBase<void,_void_()>::dispatch
              (&(local_138.m_d.d)->super_PromiseDataBase<void,_void_()>);
  }
  QtPromise::QPromiseBase<int>::~QPromiseBase(&local_128);
  QtPromise::QPromiseBase<void>::~QPromiseBase(&local_138);
  QtPromise::QPromiseBase<int>::~QPromiseBase(&p_1.super_QPromiseBase<int>);
  QtPromise::QPromiseBase<int>::~QPromiseBase(&local_b0);
  QtPromise::QPromiseBase<int>::~QPromiseBase(&local_50);
  resolver.m_d.d._0_4_ = 0xffffffff;
  iVar7 = waitForValue<int>(&p,(int *)&resolver);
  cVar6 = QTest::qCompare(iVar7,0x2a,"waitForValue(p, -1)","42",
                          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_delay.cpp"
                          ,0x4e);
  if (cVar6 != '\0') {
    bVar5 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isFulfilled
                      (&(p.super_QPromiseBase<int>.m_d.d)->
                        super_PromiseDataBase<int,_void_(const_int_&)>);
    resolver.m_d.d._0_1_ = bVar5;
    p_1.super_QPromiseBase<int>._vptr_QPromiseBase =
         (_func_int **)CONCAT71(p_1.super_QPromiseBase<int>._vptr_QPromiseBase._1_7_,1);
    bVar5 = QTest::qCompare<bool,bool>
                      ((bool *)&resolver,(bool *)&p_1,"p.isFulfilled()","true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_delay.cpp"
                       ,0x4f);
    if (bVar5) {
      cVar6 = QTest::qVerify(0x3ab < elapsed,"elapsed >= static_cast<qint64>(1000 * 0.94)","",
                             "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_delay.cpp"
                             ,0x54);
      if (cVar6 != '\0') {
        QTest::qVerify(elapsed < 0x425,"elapsed <= static_cast<qint64>(1000 * 1.06)","",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_delay.cpp"
                       ,0x55);
      }
    }
  }
  QtPromise::QPromiseBase<int>::~QPromiseBase(&p.super_QPromiseBase<int>);
  return;
}

Assistant:

void tst_qpromise_delay::fulfilledStdChrono()
{
    QElapsedTimer timer;
    qint64 elapsed = -1;

    timer.start();

    auto p = QtPromise::QPromise<int>::resolve(42).delay(std::chrono::seconds{1}).finally([&]() {
        elapsed = timer.elapsed();
    });

    QCOMPARE(waitForValue(p, -1), 42);
    QCOMPARE(p.isFulfilled(), true);

    // Qt::CoarseTimer (default) Coarse timers try to
    // keep accuracy within 5% of the desired interval.
    // Require accuracy within 6% for passing the test.
    QVERIFY(elapsed >= static_cast<qint64>(1000 * 0.94));
    QVERIFY(elapsed <= static_cast<qint64>(1000 * 1.06));
}